

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O1

uint128 CityHash128WithSeed(char *s,size_t len,uint128 seed)

{
  uint64 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  uint128 uVar18;
  
  uVar4 = seed.second;
  uVar5 = seed.first;
  if (len < 0x80) {
    if ((long)len < 0x11) {
      uVar5 = (uVar5 * -0x4b6d499041670d8d >> 0x2f ^ uVar5 * -0x4b6d499041670d8d) *
              -0x4b6d499041670d8d;
      uVar1 = HashLen0to16(s,len);
      uVar2 = uVar1 + uVar4 * -0x4b6d499041670d8d;
      uVar9 = uVar2;
      if (7 < len) {
        uVar9 = *(ulong *)s;
      }
      uVar3 = uVar9 + uVar5 >> 0x2f ^ uVar9 + uVar5;
    }
    else {
      uVar9 = (*(long *)(s + (len - 8)) + 0xb492b66fbe98f273U ^ uVar5) * -0x622015f714c7d297;
      uVar9 = (uVar9 >> 0x2f ^ uVar5 ^ uVar9) * -0x622015f714c7d297;
      uVar2 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297;
      uVar9 = (uVar4 + len ^ *(long *)(s + (len - 0x10)) + uVar2) * -0x622015f714c7d297;
      uVar9 = (uVar9 >> 0x2f ^ *(long *)(s + (len - 0x10)) + uVar2 ^ uVar9) * -0x622015f714c7d297;
      uVar3 = (uVar9 >> 0x2f ^ uVar9) * -0x622015f714c7d297;
      uVar5 = uVar5 + uVar3;
      lVar15 = len + 0x10;
      do {
        uVar5 = (((ulong)(*(long *)s * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)s * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar5) *
                -0x4b6d499041670d8d;
        uVar4 = uVar4 ^ uVar5;
        uVar2 = (((ulong)(*(long *)((long)s + 8) * -0x4b6d499041670d8d) >> 0x2f ^
                 *(long *)((long)s + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar2) *
                -0x4b6d499041670d8d;
        uVar3 = uVar3 ^ uVar2;
        s = (char *)((long)s + 0x10);
        lVar15 = lVar15 + -0x10;
      } while (0x20 < lVar15);
    }
    uVar5 = (uVar5 ^ uVar2) * -0x622015f714c7d297;
    uVar5 = (uVar5 >> 0x2f ^ uVar2 ^ uVar5) * -0x622015f714c7d297;
    uVar9 = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297;
    uVar5 = (uVar3 ^ uVar4) * -0x622015f714c7d297;
    uVar4 = (uVar5 >> 0x2f ^ uVar4 ^ uVar5) * -0x622015f714c7d297;
    uVar5 = (uVar4 >> 0x2f ^ uVar4) * -0x622015f714c7d297 ^ uVar9;
    uVar4 = uVar5;
  }
  else {
    uVar11 = len * -0x4b6d499041670d8d;
    uVar3 = ((uVar4 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar4 ^ 0xb492b66fbe98f273) << 0xf) *
            -0x4b6d499041670d8d + *(long *)s;
    lVar15 = (uVar3 >> 0x2a | uVar3 * 0x400000) * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar9 = (uVar11 + uVar4 >> 0x23 | (uVar11 + uVar4) * 0x20000000) * -0x4b6d499041670d8d + uVar5;
    uVar2 = (*(long *)(s + 0x58) + uVar5 >> 0x35 | (*(long *)(s + 0x58) + uVar5) * 0x800) *
            -0x4b6d499041670d8d;
    plVar10 = (long *)(s + 0x78);
    sVar7 = len;
    do {
      uVar5 = uVar5 + uVar3 + uVar4 + plVar10[-0xe];
      uVar4 = uVar4 + lVar15 + plVar10[-9];
      uVar5 = (uVar5 >> 0x25 | uVar5 * 0x8000000) * -0x4b6d499041670d8d ^ uVar2;
      lVar8 = uVar3 + plVar10[-10] + (uVar4 >> 0x2a | uVar4 * 0x400000) * -0x4b6d499041670d8d;
      lVar12 = (uVar11 + uVar9 >> 0x21 | (uVar11 + uVar9) * 0x80000000) * -0x4b6d499041670d8d;
      lVar15 = lVar15 * -0x4b6d499041670d8d + plVar10[-0xf];
      uVar4 = uVar9 + lVar15 + plVar10[-0xc] + uVar5;
      uVar9 = plVar10[-0xe] + lVar15 + plVar10[-0xd];
      lVar6 = uVar9 + plVar10[-0xc];
      lVar14 = (uVar9 >> 0x2c | uVar9 * 0x100000) + lVar15 + (uVar4 >> 0x15 | uVar4 << 0x2b);
      lVar15 = uVar2 + lVar12 + plVar10[-0xb];
      uVar9 = plVar10[-0xd] + lVar15 + lVar8 + plVar10[-8];
      uVar4 = plVar10[-10] + plVar10[-9] + lVar15;
      lVar13 = uVar4 + plVar10[-8];
      uVar16 = (uVar4 >> 0x2c | uVar4 * 0x100000) + lVar15 + (uVar9 >> 0x15 | uVar9 << 0x2b);
      uVar9 = lVar12 + lVar6 + plVar10[-6] + lVar8;
      uVar4 = lVar8 + plVar10[-1] + lVar14;
      uVar11 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * -0x4b6d499041670d8d ^ uVar16;
      uVar4 = lVar6 + plVar10[-2] + (uVar4 >> 0x2a | uVar4 * 0x400000) * -0x4b6d499041670d8d;
      uVar5 = uVar5 + lVar13;
      uVar5 = (uVar5 >> 0x21 | uVar5 * 0x80000000) * -0x4b6d499041670d8d;
      lVar15 = lVar14 * -0x4b6d499041670d8d + plVar10[-7];
      uVar9 = lVar13 + uVar11 + plVar10[-4] + lVar15;
      uVar2 = plVar10[-6] + plVar10[-5] + lVar15;
      uVar3 = uVar2 + plVar10[-4];
      lVar15 = (uVar2 >> 0x2c | uVar2 * 0x100000) + lVar15 + (uVar9 >> 0x15 | uVar9 << 0x2b);
      lVar6 = uVar16 + uVar5 + plVar10[-3];
      uVar16 = plVar10[-5] + uVar4 + *plVar10 + lVar6;
      uVar2 = plVar10[-2] + plVar10[-1] + lVar6;
      uVar9 = uVar2 + *plVar10;
      uVar2 = (uVar2 >> 0x2c | uVar2 * 0x100000) + lVar6 + (uVar16 >> 0x15 | uVar16 << 0x2b);
      sVar7 = sVar7 - 0x80;
      plVar10 = plVar10 + 0x10;
    } while (0x7f < sVar7);
    uVar5 = (uVar3 + uVar11 >> 0x31 | (uVar3 + uVar11) * 0x8000) * -0x3c5a37a36834ced9 + uVar5;
    lVar6 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * -0x3c5a37a36834ced9 + uVar11;
    if (sVar7 != 0) {
      plVar10 = (long *)(s + (len - 8));
      uVar11 = 0;
      do {
        uVar11 = uVar11 + 0x20;
        uVar4 = (uVar4 + uVar5 >> 0x2a | (uVar4 + uVar5) * 0x400000) * -0x3c5a37a36834ced9 + lVar15;
        uVar9 = uVar9 + plVar10[-1];
        uVar5 = uVar5 * -0x3c5a37a36834ced9 + uVar9;
        lVar6 = lVar6 + uVar2 + plVar10[-3];
        uVar2 = uVar2 + uVar3;
        lVar8 = plVar10[-3] + uVar3 + lVar6;
        uVar16 = lVar15 + *plVar10 + lVar8;
        uVar17 = plVar10[-1] + plVar10[-2] + lVar8;
        uVar3 = uVar17 + *plVar10;
        lVar15 = (uVar17 >> 0x2c | uVar17 * 0x100000) + lVar8 + (uVar16 >> 0x15 | uVar16 << 0x2b);
        plVar10 = plVar10 + -4;
      } while (uVar11 < sVar7);
    }
    uVar5 = (uVar5 ^ uVar3) * -0x622015f714c7d297;
    uVar5 = (uVar5 >> 0x2f ^ uVar3 ^ uVar5) * -0x622015f714c7d297;
    lVar8 = (uVar5 >> 0x2f ^ uVar5) * -0x622015f714c7d297;
    uVar4 = (lVar6 + uVar4 ^ uVar9) * -0x622015f714c7d297;
    uVar4 = (uVar4 >> 0x2f ^ uVar9 ^ uVar4) * -0x622015f714c7d297;
    uVar4 = uVar4 >> 0x2f ^ uVar4;
    uVar5 = (lVar8 + lVar15 ^ uVar2) * -0x622015f714c7d297;
    uVar5 = (uVar5 >> 0x2f ^ uVar2 ^ uVar5) * -0x622015f714c7d297;
    uVar5 = ((uVar5 >> 0x2f ^ uVar5) + uVar4) * -0x622015f714c7d297;
    uVar9 = uVar4 * -0x622015f714c7d297 + lVar15;
    uVar4 = lVar8 + uVar2 ^ uVar9;
  }
  uVar4 = (uVar4 * -0x622015f714c7d297 >> 0x2f ^ uVar9 ^ uVar4 * -0x622015f714c7d297) *
          -0x622015f714c7d297;
  uVar18.second = (uVar4 >> 0x2f ^ uVar4) * -0x622015f714c7d297;
  uVar18.first = uVar5;
  return uVar18;
}

Assistant:

uint128 CityHash128WithSeed(const char *s, size_t len, uint128 seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64, uint64> v, w;
  uint64 x = Uint128Low64(seed);
  uint64 y = Uint128High64(seed);
  uint64 z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch64(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch64(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch64(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  z += Rotate(w.first, 37) * k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch64(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch64(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128(HashLen16(x + v.second, w.second) + y,
                 HashLen16(x + w.second, y + v.second));
}